

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O3

void mxx::impl::scatterv_big<std::pair<int,int>>
               (pair<int,_int> *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               pair<int,_int> *out,size_t recv_size,int root,comm *comm)

{
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  MPI_Request *ppoVar3;
  pointer puVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  datatype dt_1;
  datatype dt;
  requests reqs;
  datatype local_90;
  datatype local_78;
  requests local_60;
  ulong local_40;
  comm *local_38;
  
  uVar9 = (ulong)(uint)root;
  local_60._vptr_requests = (_func_int **)&PTR__requests_001a5d90;
  local_60.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (comm->m_rank == root) {
    if (0 < comm->m_size) {
      uVar7 = 0;
      lVar8 = 0;
      local_40 = uVar9;
      local_38 = comm;
      do {
        local_90.mpitype = datatype_builder<std::pair<int,_int>_>::get_type();
        local_90._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
        local_90.builtin = false;
        datatype::contiguous
                  (&local_78,&local_90,
                   (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar7]);
        datatype::~datatype(&local_90);
        poVar2 = local_78.mpitype;
        if (uVar7 == uVar9) {
          puVar4 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (0 < (long)puVar4[uVar9]) {
            uVar5 = puVar4[uVar9] + 1;
            lVar6 = 0;
            do {
              *(undefined8 *)((long)&out->first + lVar6) =
                   *(undefined8 *)((long)&msgs[lVar8].first + lVar6);
              uVar5 = uVar5 - 1;
              lVar6 = lVar6 + 8;
            } while (1 < uVar5);
          }
        }
        else {
          poVar1 = comm->mpi_comm;
          ppoVar3 = requests::add(&local_60);
          MPI_Isend(msgs + lVar8,1,poVar2,uVar7 & 0xffffffff,0x4d2,poVar1,ppoVar3);
          puVar4 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          comm = local_38;
          uVar9 = local_40;
        }
        lVar8 = lVar8 + puVar4[uVar7];
        datatype::~datatype(&local_78);
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)comm->m_size);
    }
  }
  else {
    local_90.mpitype = datatype_builder<std::pair<int,_int>_>::get_type();
    local_90._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
    local_90.builtin = false;
    datatype::contiguous(&local_78,&local_90,recv_size);
    datatype::~datatype(&local_90);
    poVar1 = comm->mpi_comm;
    ppoVar3 = requests::add(&local_60);
    MPI_Irecv(out,1,local_78.mpitype,uVar9,0x4d2,poVar1,ppoVar3);
    datatype::~datatype(&local_78);
  }
  MPI_Waitall((ulong)((long)local_60.m_requests.
                            super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_60.m_requests.
                           super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3,
              local_60.m_requests.
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_start,0);
  requests::~requests(&local_60);
  return;
}

Assistant:

void scatterv_big(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        std::size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(msgs+offset, msgs+offset+sizes[i], out);
            } else {
                MPI_Isend(const_cast<T*>(msgs)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_size);
        MPI_Irecv(const_cast<T*>(out), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}